

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::CompressionParameters> *
kj::_::tryParseExtensionOffers
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers)

{
  bool bVar1;
  ArrayPtr<const_char> *pAVar2;
  ArrayPtr<const_char> *this;
  NullableValue<kj::CompressionParameters> *other;
  CompressionParameters *pCVar3;
  CompressionParameters *pCVar4;
  char in_R8B;
  ArrayPtr<const_char> AVar5;
  ArrayPtr<const_char> input;
  CompressionParameters *config;
  undefined1 local_110 [8];
  NullableValue<kj::CompressionParameters> _config5141;
  ArrayPtr<const_char> local_d8;
  ArrayPtr<const_char> local_c8;
  _ *local_b8;
  char *pcStack_b0;
  undefined1 local_a0 [8];
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  ArrayPtr<const_char> *offer;
  ArrayPtr<const_char> *__end2;
  ArrayPtr<const_char> *local_60;
  ArrayPtr<const_char> *__begin2;
  Vector<kj::ArrayPtr<const_char>_> *__range2;
  char *local_48;
  undefined1 local_40 [8];
  Vector<kj::ArrayPtr<const_char>_> splitOffers;
  StringPtr offers_local;
  
  splitOffers.builder.disposer = (ArrayDisposer *)offers.content.ptr;
  AVar5 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&splitOffers.builder.disposer);
  __range2 = (Vector<kj::ArrayPtr<const_char>_> *)AVar5.ptr;
  local_48 = (char *)AVar5.size_;
  AVar5.size_ = 0x2c;
  AVar5.ptr = local_48;
  splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_40,(_ *)__range2,AVar5,in_R8B);
  local_60 = Vector<kj::ArrayPtr<const_char>_>::begin((Vector<kj::ArrayPtr<const_char>_> *)local_40)
  ;
  pAVar2 = Vector<kj::ArrayPtr<const_char>_>::end((Vector<kj::ArrayPtr<const_char>_> *)local_40);
  for (; local_60 != pAVar2; local_60 = local_60 + 1) {
    splitOffer.builder.disposer = (ArrayDisposer *)local_60;
    local_b8 = (_ *)local_60->ptr;
    pcStack_b0 = (char *)local_60->size_;
    input.size_ = 0x3b;
    input.ptr = pcStack_b0;
    splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_a0,local_b8,input,in_R8B);
    this = Vector<kj::ArrayPtr<const_char>_>::front((Vector<kj::ArrayPtr<const_char>_> *)local_a0);
    AVar5 = (ArrayPtr<const_char>)operator____kj("permessage-deflate",0x12);
    local_d8 = AVar5;
    AVar5 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_d8);
    local_c8 = AVar5;
    bVar1 = ArrayPtr<const_char>::operator==(this,&local_c8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tryExtractParameters
                ((Maybe<kj::CompressionParameters> *)&config,
                 (Vector<kj::ArrayPtr<const_char>_> *)local_a0,false);
      other = readMaybe<kj::CompressionParameters>((Maybe<kj::CompressionParameters> *)&config);
      NullableValue<kj::CompressionParameters>::NullableValue
                ((NullableValue<kj::CompressionParameters> *)local_110,other);
      Maybe<kj::CompressionParameters>::~Maybe((Maybe<kj::CompressionParameters> *)&config);
      pCVar3 = NullableValue::operator_cast_to_CompressionParameters_((NullableValue *)local_110);
      if (pCVar3 != (CompressionParameters *)0x0) {
        pCVar4 = NullableValue<kj::CompressionParameters>::operator*
                           ((NullableValue<kj::CompressionParameters> *)local_110);
        pCVar4 = mv<kj::CompressionParameters>(pCVar4);
        Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__,pCVar4);
      }
      _config5141.field_1._37_3_ = 0;
      _config5141.field_1._36_1_ = pCVar3 != (CompressionParameters *)0x0;
      NullableValue<kj::CompressionParameters>::~NullableValue
                ((NullableValue<kj::CompressionParameters> *)local_110);
      if (_config5141.field_1._36_4_ == 0) {
        _config5141.field_1._36_4_ = 0;
      }
    }
    else {
      _config5141.field_1._36_4_ = 3;
    }
    Vector<kj::ArrayPtr<const_char>_>::~Vector((Vector<kj::ArrayPtr<const_char>_> *)local_a0);
    if ((_config5141.field_1._36_4_ != 0) && (_config5141.field_1._36_4_ != 3)) goto LAB_006202be;
  }
  Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
  _config5141.field_1._36_4_ = 1;
LAB_006202be:
  Vector<kj::ArrayPtr<const_char>_>::~Vector((Vector<kj::ArrayPtr<const_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> tryParseExtensionOffers(StringPtr offers) {
  // Given a string of offers, accept the first valid offer by returning a `CompressionParameters`
  // struct. If there are no valid offers, return `kj::none`.
  auto splitOffers = splitParts(offers, ',');

  for (const auto& offer : splitOffers) {
    auto splitOffer = splitParts(offer, ';');

    if (splitOffer.front() != "permessage-deflate"_kj) {
      // Extension token was invalid.
      continue;
    }
    KJ_IF_SOME(config, tryExtractParameters(splitOffer, false)) {
      return kj::mv(config);
    }
  }
  return kj::none;
}